

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O3

ValueType __thiscall ValueType::SetArrayTypeId(ValueType *this,TypeId typeId)

{
  code *pcVar1;
  bool bVar2;
  Bits bits;
  ObjectType OVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_22;
  
  local_22.bits = (Type)((ulong)in_RAX >> 0x30);
  bVar2 = IsLikelyArrayOrObjectWithArray(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x330,"(IsLikelyArrayOrObjectWithArray())",
                       "IsLikelyArrayOrObjectWithArray()");
    if (!bVar2) goto LAB_00b1126d;
    *puVar4 = 0;
  }
  bVar2 = Js::JavascriptArray::IsNonES5Array(typeId);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x331,"(JavascriptArray::IsNonES5Array(typeId))",
                       "JavascriptArray::IsNonES5Array(typeId)");
    if (!bVar2) goto LAB_00b1126d;
    *puVar4 = 0;
  }
  if (typeId == TypeIds_Array) {
    bits = (this->field_0).bits | IntIsLikelyUntagged;
  }
  else {
    if (((this->field_0).bits & Object) == 0) {
LAB_00b111e5:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x332,
                         "(typeId == TypeIds_Array || IsLikelyObject() && GetObjectType() == ObjectType::Array)"
                         ,
                         "typeId == TypeIds_Array || IsLikelyObject() && GetObjectType() == ObjectType::Array"
                        );
      if (!bVar2) {
LAB_00b1126d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    else {
      OVar3 = GetObjectType(this);
      if (OVar3 != Array) goto LAB_00b111e5;
    }
    bits = (this->field_0).bits & ~(IntIsLikelyUntagged|IntCanBeUntagged);
    if (typeId != TypeIds_ArrayLast) goto LAB_00b11247;
  }
  bits = bits | IntCanBeUntagged;
LAB_00b11247:
  ValueType((ValueType *)&local_22.field_0,bits);
  Verify((ValueType)local_22.field_0);
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)local_22.field_0;
}

Assistant:

ValueType ValueType::SetArrayTypeId(const Js::TypeId typeId) const
{
    using namespace Js;
    Assert(IsLikelyArrayOrObjectWithArray());
    Assert(JavascriptArray::IsNonES5Array(typeId));
    Assert(typeId == TypeIds_Array || IsLikelyObject() && GetObjectType() == ObjectType::Array); // objects with native arrays are currently not supported

    Bits newBits = bits & ~(Bits::NonInts | Bits::NonFloats);
    switch(typeId)
    {
        case TypeIds_Array:
            newBits |= Bits::NonFloats;
            // fall through

        case TypeIds_NativeFloatArray:
            newBits |= Bits::NonInts;
            break;
    }
    return Verify(newBits);
}